

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_filter.c
# Opt level: O3

gdImagePtr gdImageCopyGaussianBlurred(gdImagePtr src,int radius,double sigma)

{
  uint uVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  int iVar5;
  double *coeffs;
  ulong uVar6;
  gdImagePtr dst;
  gdImagePtr dst_00;
  long lVar7;
  double dVar8;
  
  if (radius < 1) {
    return (gdImagePtr)0x0;
  }
  uVar1 = radius * 2 + 1;
  coeffs = (double *)gdMalloc((ulong)uVar1 * 8);
  if (coeffs == (double *)0x0) {
    return (gdImagePtr)0x0;
  }
  dVar8 = 0.0;
  dVar3 = (double)(-(ulong)(sigma <= 0.0) & (ulong)((double)radius * 0.6666666666666666) |
                  ~-(ulong)(sigma <= 0.0) & (ulong)sigma);
  lVar7 = 0;
  do {
    iVar4 = (int)lVar7 - radius;
    dVar2 = exp((double)-(iVar4 * iVar4) / ((dVar3 + dVar3) * dVar3));
    dVar8 = dVar8 + dVar2;
    coeffs[((ulong)(uint)radius + lVar7) - (long)radius] = dVar2;
    lVar7 = lVar7 + 1;
  } while (uVar1 != (uint)lVar7);
  uVar6 = 0;
  do {
    coeffs[uVar6] = coeffs[uVar6] / dVar8;
    uVar6 = uVar6 + 1;
  } while (uVar1 != uVar6);
  iVar4 = src->trueColor;
  if (iVar4 == 0) {
    src = gdImageClone(src);
    if (src == (gdImagePtr)0x0) goto LAB_00115269;
    iVar5 = gdImagePaletteToTrueColor(src);
    if (iVar5 == 0) {
      gdImageDestroy(src);
      goto LAB_00115269;
    }
  }
  dst = gdImageCreateTrueColor(src->sx,src->sy);
  if (dst != (gdImagePtr)0x0) {
    applyCoeffs(src,dst,coeffs,radius,HORIZONTAL);
    dst_00 = gdImageCreateTrueColor(src->sx,src->sy);
    if (dst_00 != (gdImagePtr)0x0) {
      applyCoeffs(dst,dst_00,coeffs,radius,VERTICAL);
    }
    gdImageDestroy(dst);
    gdFree(coeffs);
    if (iVar4 == 0) {
      gdImageDestroy(src);
      return dst_00;
    }
    return dst_00;
  }
LAB_00115269:
  gdFree(coeffs);
  return (gdImagePtr)0x0;
}

Assistant:

BGD_DECLARE(gdImagePtr)
gdImageCopyGaussianBlurred(gdImagePtr src, int radius, double sigma)
{
    gdImagePtr tmp = NULL, result = NULL;
    double *coeffs;
    int freeSrc = 0;

    if (radius < 1) {
        return NULL;
    }/* if */

    /* Compute the coefficients. */
    coeffs = gaussian_coeffs(radius, sigma);
    if (!coeffs) {
        return NULL;
    }/* if */

    /* If the image is not truecolor, we first make a truecolor
     * scratch copy. */
	if (!src->trueColor) {
        int tcstat;

        src = gdImageClone(src);
        if (!src) {
			gdFree(coeffs);
			return NULL;
		}

        tcstat = gdImagePaletteToTrueColor(src);
        if (!tcstat) {
            gdImageDestroy(src);
			gdFree(coeffs);
            return NULL;
        }/* if */
		
        freeSrc = 1;
	}/* if */

    /* Apply the filter horizontally. */
    tmp = gdImageCreateTrueColor(src->sx, src->sy);
    if (!tmp) {
		gdFree(coeffs);
		return NULL;
	}
    applyCoeffs(src, tmp, coeffs, radius, HORIZONTAL);

    /* Apply the filter vertically. */
    result = gdImageCreateTrueColor(src->sx, src->sy);
    if (result) {
        applyCoeffs(tmp, result, coeffs, radius, VERTICAL);
    }/* if */

    gdImageDestroy(tmp);
    gdFree(coeffs);

    if (freeSrc) gdImageDestroy(src);

    return result;
}